

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O2

adt_error_t adt_str_append_bstr(adt_str_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  adt_str_encoding_t aVar1;
  adt_error_t aVar2;
  int iVar3;
  int32_t strSize;
  
  if (pEnd < pBegin) {
    return '\x01';
  }
  if (self == (adt_str_t *)0x0) {
    return '\x01';
  }
  if (pBegin == (uint8_t *)0x0) {
    return '\x01';
  }
  if (pEnd != (uint8_t *)0x0) {
    iVar3 = (int)pEnd - (int)pBegin;
    if (0 < iVar3) {
      strSize = 0;
      aVar1 = adt_utf8_checkEncodingAndSize(pBegin,iVar3,&strSize);
      if ((strSize < 1) || (1 < (byte)(aVar1 - 1))) {
        if (strSize != 0) {
          return '\a';
        }
        return '\0';
      }
      iVar3 = strSize + self->s32Cur;
      aVar2 = adt_str_reserve(self,iVar3);
      if (aVar2 != '\0') {
        return aVar2;
      }
      if (self->pAlloc == (uint8_t *)0x0) {
        __assert_fail("self->pAlloc != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                      ,0x19a,
                      "adt_error_t adt_str_append_bstr(adt_str_t *, const uint8_t *, const uint8_t *)"
                     );
      }
      if (self->s32Size <= iVar3) {
        __assert_fail("self->s32Size > newLen",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                      ,0x19b,
                      "adt_error_t adt_str_append_bstr(adt_str_t *, const uint8_t *, const uint8_t *)"
                     );
      }
      memcpy(self->pAlloc + self->s32Cur,pBegin,(long)strSize);
      self->s32Cur = iVar3;
      if (self->encoding == '\x01' && aVar1 == '\x02') {
        self->encoding = '\x02';
      }
    }
    return '\0';
  }
  return '\x01';
}

Assistant:

adt_error_t adt_str_append_bstr(adt_str_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   adt_error_t retval = ADT_NO_ERROR;
   if( (self == 0) || (pBegin == 0) || (pEnd == 0) || (pEnd < pBegin) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      int32_t bufLen = (int32_t) (pEnd-pBegin);
      if (bufLen > 0)
      {
         int32_t strSize = 0;
         adt_str_encoding_t encoding = adt_utf8_checkEncodingAndSize(pBegin, bufLen, &strSize);
         if ( (strSize > 0) && ( (encoding == ADT_STR_ENCODING_ASCII) || (encoding == ADT_STR_ENCODING_UTF8) ) )
         {
            adt_error_t result;
            int32_t newLen;
            newLen = self->s32Cur + strSize;
            result = adt_str_reserve(self, newLen);
            if (result == ADT_NO_ERROR)
            {
               assert(self->pAlloc != 0);
               assert(self->s32Size > newLen);
               memcpy(self->pAlloc + self->s32Cur, pBegin, strSize);
               self->s32Cur = newLen;
               if ( (self->encoding == ADT_STR_ENCODING_ASCII) && (encoding == ADT_STR_ENCODING_UTF8) )
               {
                  self->encoding = encoding;
               }
            }
            else
            {
               retval = result;
            }
         }
         else if (strSize == 0)
         {
            retval = ADT_NO_ERROR;
         }
         else
         {
            retval = ADT_UNKNOWN_ENCODING_ERROR;
         }
      }
   }
   return retval;
}